

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_delete(JSParseState *s)

{
  JSValue val_00;
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  JSParseState *in_RDI;
  JSValue v;
  int unaff_retaddr;
  JSParseState *in_stack_00000008;
  int ret;
  JSValue val;
  int opcode;
  JSAtom name;
  JSFunctionDef *fd;
  JSAtom in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb8 [16];
  unkbyte9 Var4;
  JSFunctionDef *fd_00;
  
  Var4 = in_stack_ffffffffffffffb8._7_9_;
  fd_00 = in_RDI->cur_func;
  iVar1 = next_token(in_stack_00000008);
  if (iVar1 != 0) {
    return -1;
  }
  iVar1 = js_parse_unary(in_stack_00000008,unaff_retaddr);
  if (iVar1 == 0) {
    iVar1 = get_prev_opcode(fd_00);
    if (iVar1 == 0x41) {
      iVar2 = iVar1;
      uVar3 = get_u32((fd_00->byte_code).buf + (long)fd_00->last_opcode_pos + 1);
      (fd_00->byte_code).size = (long)fd_00->last_opcode_pos;
      fd_00->last_opcode_pos = -1;
      v = JS_AtomToValue((JSContext *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac);
      val_00.u._4_4_ = uVar3;
      val_00.u.int32 = iVar2;
      val_00.tag = (int64_t)fd_00;
      iVar2 = emit_push_const((JSParseState *)v.tag,val_00,v.u._4_4_);
      JS_FreeValue((JSContext *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),v);
      Var4 = v._7_9_;
      JS_FreeAtom((JSContext *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac);
      if (iVar2 != 0) {
        return iVar2;
      }
    }
    else {
      if (iVar1 != 0x47) {
        if (iVar1 == 0x4a) {
          emit_op((JSParseState *)((unkuint9)Var4 >> 8),(uint8_t)Var4);
          emit_atom((JSParseState *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffac);
          emit_u8((JSParseState *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
                  (uint8_t)(in_stack_ffffffffffffffac >> 0x18));
          return 0;
        }
        if (iVar1 == 0xb6) {
          uVar3 = get_u32((fd_00->byte_code).buf + (long)fd_00->last_opcode_pos + 1);
          if ((uVar3 != 8) && (uVar3 != 0x71)) {
            if ((fd_00->js_mode & 1) == 0) {
              (fd_00->byte_code).buf[fd_00->last_opcode_pos] = 0xb8;
              return 0;
            }
            iVar1 = js_parse_error(in_RDI,"cannot delete a direct reference in strict mode");
            return iVar1;
          }
        }
        else if (iVar1 == 0xbc) {
          iVar1 = js_parse_error(in_RDI,"cannot delete a private class field");
          return iVar1;
        }
        emit_op((JSParseState *)((unkuint9)Var4 >> 8),(uint8_t)Var4);
        emit_op((JSParseState *)((unkuint9)Var4 >> 8),(uint8_t)Var4);
        return 0;
      }
      (fd_00->byte_code).size = (long)fd_00->last_opcode_pos;
      fd_00->last_opcode_pos = -1;
    }
    emit_op((JSParseState *)((unkuint9)Var4 >> 8),(uint8_t)Var4);
    return 0;
  }
  return -1;
}

Assistant:

static __exception int js_parse_delete(JSParseState *s)
{
    JSFunctionDef *fd = s->cur_func;
    JSAtom name;
    int opcode;

    if (next_token(s))
        return -1;
    if (js_parse_unary(s, PF_POW_FORBIDDEN))
        return -1;
    switch(opcode = get_prev_opcode(fd)) {
    case OP_get_field:
        {
            JSValue val;
            int ret;

            name = get_u32(fd->byte_code.buf + fd->last_opcode_pos + 1);
            fd->byte_code.size = fd->last_opcode_pos;
            fd->last_opcode_pos = -1;
            val = JS_AtomToValue(s->ctx, name);
            ret = emit_push_const(s, val, 1);
            JS_FreeValue(s->ctx, val);
            JS_FreeAtom(s->ctx, name);
            if (ret)
                return ret;
        }
        goto do_delete;
    case OP_get_array_el:
        fd->byte_code.size = fd->last_opcode_pos;
        fd->last_opcode_pos = -1;
    do_delete:
        emit_op(s, OP_delete);
        break;
    case OP_scope_get_var:
        /* 'delete this': this is not a reference */
        name = get_u32(fd->byte_code.buf + fd->last_opcode_pos + 1);
        if (name == JS_ATOM_this || name == JS_ATOM_new_target)
            goto ret_true;
        if (fd->js_mode & JS_MODE_STRICT) {
            return js_parse_error(s, "cannot delete a direct reference in strict mode");
        } else {
            fd->byte_code.buf[fd->last_opcode_pos] = OP_scope_delete_var;
        }
        break;
    case OP_scope_get_private_field:
        return js_parse_error(s, "cannot delete a private class field");
    case OP_get_super_value:
        emit_op(s, OP_throw_error);
        emit_atom(s, JS_ATOM_NULL);
        emit_u8(s, JS_THROW_ERROR_DELETE_SUPER);
        break;
    default:
    ret_true:
        emit_op(s, OP_drop);
        emit_op(s, OP_push_true);
        break;
    }
    return 0;
}